

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void highbd_dr_prediction_32bit_z2_Nx4_avx2
               (int N,uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,
               int upsample_above,int upsample_left,int dx,int dy)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long in_RCX;
  long in_RDX;
  undefined8 *in_RSI;
  int in_EDI;
  int iVar15;
  long in_R8;
  uint in_R9D;
  byte bStack0000000000000008;
  __m128i mask128;
  __m128i base_y_c128;
  __m128i y_c128;
  __m128i dy128;
  __m128i c1234;
  __m128i r6;
  __m128i shifty;
  __m128i a1_y;
  __m128i a0_y;
  int base_min_diff;
  int base_shift;
  int base_x;
  int y;
  __m128i a1_x128;
  __m128i a0_x128;
  __m128i resxy;
  __m128i resy;
  __m128i resx;
  __m256i shift;
  __m256i res;
  __m256i b;
  int r;
  __m128i min_base_y128;
  __m128i c3f;
  __m256i diff;
  __m256i a16;
  __m256i a32;
  __m256i a1_x;
  __m256i a0_x;
  int frac_bits_y;
  int frac_bits_x;
  int min_base_y;
  int min_base_x;
  int local_9a0;
  int iStack_99c;
  int iStack_998;
  int iStack_994;
  undefined1 local_930 [16];
  int local_900;
  int local_8fc;
  undefined1 local_8f0 [16];
  undefined1 local_8e0 [16];
  undefined8 local_8d0;
  undefined1 local_8c0 [16];
  undefined1 local_8a0 [32];
  undefined1 auStack_870 [16];
  int local_824;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  byte local_74c;
  undefined8 *local_730;
  undefined8 uStack_570;
  undefined8 uStack_568;
  
  local_74c = (byte)in_R9D;
  iVar14 = -(1 << (local_74c & 0x1f));
  uVar11 = -(1 << (bStack0000000000000008 & 0x1f));
  auVar2 = vpinsrd_avx(ZEXT416(0x10),0x10,1);
  auVar2 = vpinsrd_avx(auVar2,0x10,2);
  auVar2 = vpinsrd_avx(auVar2,0x10,3);
  auVar3 = vpinsrd_avx(ZEXT416(0x10),0x10,1);
  auVar3 = vpinsrd_avx(auVar3,0x10,2);
  auVar3 = vpinsrd_avx(auVar3,0x10,3);
  uStack_570 = auVar3._0_8_;
  uStack_568 = auVar3._8_8_;
  auVar3 = vpinsrd_avx(ZEXT416(0x3f),0x3f,1);
  auVar3 = vpinsrd_avx(auVar3,0x3f,2);
  auVar3 = vpinsrd_avx(auVar3,0x3f,3);
  auVar4 = vpinsrd_avx(ZEXT416(uVar11),uVar11,1);
  auVar4 = vpinsrd_avx(auVar4,uVar11,2);
  auVar4 = vpinsrd_avx(auVar4,uVar11,3);
  local_730 = in_RSI;
  for (local_824 = 0; local_824 < in_EDI; local_824 = local_824 + 1) {
    iVar12 = local_824 + 1;
    iVar13 = -iVar12 * upsample_left >> (6 - local_74c & 0x1f);
    local_8fc = 0;
    if (iVar13 < iVar14 + -1) {
      local_8fc = (iVar14 - iVar13) + -1 >> (local_74c & 0x1f);
    }
    local_900 = (int)((iVar14 - iVar13) + in_R9D) >> (local_74c & 0x1f);
    if (local_900 < 5) {
      if (local_900 < 0) {
        local_900 = 0;
      }
    }
    else {
      local_900 = 4;
    }
    if (local_8fc < 4) {
      auVar1 = *(undefined1 (*) [16])(in_RCX + (long)iVar13 * 2 + (long)local_8fc * 2);
      if (in_R9D == 0) {
        local_8e0 = vpshufb_avx(auVar1,(undefined1  [16])HighbdLoadMaskx[local_8fc]);
        local_8f0 = vpsrldq_avx(local_8e0,2);
        iVar15 = iVar12 * upsample_left;
        auVar1 = vpinsrd_avx(ZEXT416((uint)(-iVar12 * upsample_left)),0x40 - iVar15,1);
        auVar1 = vpinsrd_avx(auVar1,0x80 - iVar15,2);
        auVar1 = vpinsrd_avx(auVar1,0xc0 - iVar15,3);
        auVar1 = vpand_avx(auVar1,auVar3);
        auVar1 = vpsrld_avx(auVar1,ZEXT416(1));
      }
      else {
        local_8e0 = vpshufb_avx(auVar1,(undefined1  [16])HighbdEvenOddMaskx4[local_8fc]);
        local_8f0 = vpsrldq_avx(local_8e0,8);
        iVar15 = iVar12 * upsample_left;
        auVar1 = vpinsrd_avx(ZEXT416((uint)(-iVar12 * upsample_left)),0x40 - iVar15,1);
        auVar1 = vpinsrd_avx(auVar1,0x80 - iVar15,2);
        auVar1 = vpinsrd_avx(auVar1,0xc0 - iVar15,3);
        auVar1 = vpslld_avx(auVar1,ZEXT416(in_R9D));
        auVar1 = vpand_avx(auVar1,auVar3);
        auVar1 = vpsrld_avx(auVar1,ZEXT416(1));
      }
      local_780 = vpmovzxwd_avx2(local_8e0);
      local_7a0 = vpmovzxwd_avx2(local_8f0);
    }
    else {
      local_780._0_16_ = ZEXT816(0);
      local_780 = ZEXT1632(local_780._0_16_);
      local_7a0._0_16_ = ZEXT816(0);
      local_7a0 = ZEXT1632(local_7a0._0_16_);
      local_8a0._0_16_ = ZEXT816(0);
      auVar1 = local_8a0._0_16_;
    }
    local_8a0 = ZEXT1632(auVar1);
    if (iVar13 < iVar14) {
      uVar11 = local_824 << 6;
      auVar5 = vpinsrd_avx(ZEXT416(uVar11),uVar11,1);
      auVar5 = vpinsrd_avx(auVar5,uVar11,2);
      auVar5 = vpinsrd_avx(auVar5,uVar11,3);
      auVar6 = vpinsrd_avx(ZEXT416((uint)dx),dx,1);
      auVar6 = vpinsrd_avx(auVar6,dx,2);
      auVar6 = vpinsrd_avx(auVar6,dx,3);
      auVar7 = vpinsrd_avx(ZEXT416(1),2,1);
      auVar7 = vpinsrd_avx(auVar7,3,2);
      auVar7 = vpinsrd_avx(auVar7,4,3);
      auVar6 = vpmulld_avx(auVar7,auVar6);
      auVar7 = vpsubd_avx(auVar5,auVar6);
      auVar6 = vpsrad_avx(auVar7,ZEXT416(6 - _bStack0000000000000008));
      auVar5 = vpcmpgtd_avx(auVar4,auVar6);
      auVar5 = vpandn_avx(auVar5,auVar6);
      iStack_99c = auVar5._4_4_;
      local_9a0 = auVar5._0_4_;
      iStack_994 = auVar5._12_4_;
      iStack_998 = auVar5._8_4_;
      auVar5 = vpinsrd_avx(ZEXT216(*(ushort *)(in_R8 + (long)local_9a0 * 2)),
                           (uint)*(ushort *)(in_R8 + (long)iStack_99c * 2),1);
      auVar5 = vpinsrd_avx(auVar5,(uint)*(ushort *)(in_R8 + (long)iStack_998 * 2),2);
      auVar5 = vpinsrd_avx(auVar5,(uint)*(ushort *)(in_R8 + (long)iStack_994 * 2),3);
      auVar6 = vpinsrd_avx(ZEXT216(*(ushort *)(in_R8 + 2 + (long)local_9a0 * 2)),
                           (uint)*(ushort *)(in_R8 + 2 + (long)iStack_99c * 2),1);
      auVar6 = vpinsrd_avx(auVar6,(uint)*(ushort *)(in_R8 + 2 + (long)iStack_998 * 2),2);
      auVar6 = vpinsrd_avx(auVar6,(uint)*(ushort *)(in_R8 + 2 + (long)iStack_994 * 2),3);
      if (_bStack0000000000000008 == 0) {
        auVar7 = vpand_avx(auVar7,auVar3);
        local_930 = vpsrld_avx(auVar7,ZEXT416(1));
      }
      else {
        auVar7 = vpslld_avx(auVar7,ZEXT416(_bStack0000000000000008));
        auVar7 = vpand_avx(auVar7,auVar3);
        local_930 = vpsrld_avx(auVar7,ZEXT416(1));
      }
      auVar7 = local_780._16_16_;
      local_780._0_16_ = ZEXT116(0) * auVar5 + ZEXT116(1) * local_780._0_16_;
      local_780._16_16_ = ZEXT116(0) * auVar7 + ZEXT116(1) * auVar5;
      auVar5 = local_7a0._16_16_;
      local_7a0._0_16_ = ZEXT116(0) * auVar6 + ZEXT116(1) * local_7a0._0_16_;
      local_7a0._16_16_ = ZEXT116(0) * auVar5 + ZEXT116(1) * auVar6;
      local_8a0._0_16_ = ZEXT116(0) * local_930 + ZEXT116(1) * auVar1;
      local_8a0._16_16_ = ZEXT116(0) * ZEXT816(0) + ZEXT116(1) * local_930;
    }
    auVar9 = vpsubd_avx2(local_7a0,local_780);
    auVar8 = vpslld_avx2(local_780,ZEXT416(5));
    auVar10._16_8_ = uStack_570;
    auVar10._0_16_ = auVar2;
    auVar10._24_8_ = uStack_568;
    auVar8 = vpaddd_avx2(auVar8,auVar10);
    auVar9 = vpmulld_avx2(auVar9,local_8a0);
    auVar8 = vpaddd_avx2(auVar8,auVar9);
    auVar8 = vpsrld_avx2(auVar8,ZEXT416(5));
    vpackusdw_avx(auVar8._0_16_,auVar8._0_16_);
    auStack_870 = auVar8._16_16_;
    local_8c0 = vpackusdw_avx(local_8c0,local_8c0);
    auVar1 = vpblendvb_avx(auStack_870,local_8c0,*(undefined1 (*) [16])HighbdBaseMask[local_900]);
    local_8d0 = auVar1._0_8_;
    *local_730 = local_8d0;
    local_730 = (undefined8 *)(in_RDX * 2 + (long)local_730);
  }
  return;
}

Assistant:

static void highbd_dr_prediction_32bit_z2_Nx4_avx2(
    int N, uint16_t *dst, ptrdiff_t stride, const uint16_t *above,
    const uint16_t *left, int upsample_above, int upsample_left, int dx,
    int dy) {
  const int min_base_x = -(1 << upsample_above);
  const int min_base_y = -(1 << upsample_left);
  const int frac_bits_x = 6 - upsample_above;
  const int frac_bits_y = 6 - upsample_left;

  assert(dx > 0);
  // pre-filter above pixels
  // store in temp buffers:
  //   above[x] * 32 + 16
  //   above[x+1] - above[x]
  // final pixels will be calculated as:
  //   (above[x] * 32 + 16 + (above[x+1] - above[x]) * shift) >> 5
  __m256i a0_x, a1_x, a32, a16;
  __m256i diff;
  __m128i c3f, min_base_y128;

  a16 = _mm256_set1_epi32(16);
  c3f = _mm_set1_epi32(0x3f);
  min_base_y128 = _mm_set1_epi32(min_base_y);

  for (int r = 0; r < N; r++) {
    __m256i b, res, shift;
    __m128i resx, resy, resxy;
    __m128i a0_x128, a1_x128;
    int y = r + 1;
    int base_x = (-y * dx) >> frac_bits_x;
    int base_shift = 0;
    if (base_x < (min_base_x - 1)) {
      base_shift = (min_base_x - base_x - 1) >> upsample_above;
    }
    int base_min_diff =
        (min_base_x - base_x + upsample_above) >> upsample_above;
    if (base_min_diff > 4) {
      base_min_diff = 4;
    } else {
      if (base_min_diff < 0) base_min_diff = 0;
    }

    if (base_shift > 3) {
      a0_x = _mm256_setzero_si256();
      a1_x = _mm256_setzero_si256();
      shift = _mm256_setzero_si256();
    } else {
      a0_x128 = _mm_loadu_si128((__m128i *)(above + base_x + base_shift));
      if (upsample_above) {
        a0_x128 = _mm_shuffle_epi8(a0_x128,
                                   *(__m128i *)HighbdEvenOddMaskx4[base_shift]);
        a1_x128 = _mm_srli_si128(a0_x128, 8);

        shift = _mm256_castsi128_si256(_mm_srli_epi32(
            _mm_and_si128(
                _mm_slli_epi32(
                    _mm_setr_epi32(-y * dx, (1 << 6) - y * dx,
                                   (2 << 6) - y * dx, (3 << 6) - y * dx),
                    upsample_above),
                c3f),
            1));
      } else {
        a0_x128 =
            _mm_shuffle_epi8(a0_x128, *(__m128i *)HighbdLoadMaskx[base_shift]);
        a1_x128 = _mm_srli_si128(a0_x128, 2);

        shift = _mm256_castsi128_si256(_mm_srli_epi32(
            _mm_and_si128(_mm_setr_epi32(-y * dx, (1 << 6) - y * dx,
                                         (2 << 6) - y * dx, (3 << 6) - y * dx),
                          c3f),
            1));
      }
      a0_x = _mm256_cvtepu16_epi32(a0_x128);
      a1_x = _mm256_cvtepu16_epi32(a1_x128);
    }
    // y calc
    __m128i a0_y, a1_y, shifty;
    if (base_x < min_base_x) {
      __m128i r6, c1234, dy128, y_c128, base_y_c128, mask128;
      DECLARE_ALIGNED(32, int, base_y_c[4]);
      r6 = _mm_set1_epi32(r << 6);
      dy128 = _mm_set1_epi32(dy);
      c1234 = _mm_setr_epi32(1, 2, 3, 4);
      y_c128 = _mm_sub_epi32(r6, _mm_mullo_epi32(c1234, dy128));
      base_y_c128 = _mm_srai_epi32(y_c128, frac_bits_y);
      mask128 = _mm_cmpgt_epi32(min_base_y128, base_y_c128);
      base_y_c128 = _mm_andnot_si128(mask128, base_y_c128);
      _mm_store_si128((__m128i *)base_y_c, base_y_c128);

      a0_y = _mm_setr_epi32(left[base_y_c[0]], left[base_y_c[1]],
                            left[base_y_c[2]], left[base_y_c[3]]);
      a1_y = _mm_setr_epi32(left[base_y_c[0] + 1], left[base_y_c[1] + 1],
                            left[base_y_c[2] + 1], left[base_y_c[3] + 1]);

      if (upsample_left) {
        shifty = _mm_srli_epi32(
            _mm_and_si128(_mm_slli_epi32(y_c128, upsample_left), c3f), 1);
      } else {
        shifty = _mm_srli_epi32(_mm_and_si128(y_c128, c3f), 1);
      }
      a0_x = _mm256_inserti128_si256(a0_x, a0_y, 1);
      a1_x = _mm256_inserti128_si256(a1_x, a1_y, 1);
      shift = _mm256_inserti128_si256(shift, shifty, 1);
    }

    diff = _mm256_sub_epi32(a1_x, a0_x);  // a[x+1] - a[x]
    a32 = _mm256_slli_epi32(a0_x, 5);     // a[x] * 32
    a32 = _mm256_add_epi32(a32, a16);     // a[x] * 32 + 16

    b = _mm256_mullo_epi32(diff, shift);
    res = _mm256_add_epi32(a32, b);
    res = _mm256_srli_epi32(res, 5);

    resx = _mm256_castsi256_si128(res);
    resx = _mm_packus_epi32(resx, resx);

    resy = _mm256_extracti128_si256(res, 1);
    resy = _mm_packus_epi32(resy, resy);

    resxy =
        _mm_blendv_epi8(resx, resy, *(__m128i *)HighbdBaseMask[base_min_diff]);
    _mm_storel_epi64((__m128i *)(dst), resxy);
    dst += stride;
  }
}